

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Utils.c
# Opt level: O3

int XCountUtf8Char(uchar *buf,int len)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uint ucs;
  uint local_34;
  
  if (len < 1) {
    iVar2 = 0;
  }
  else {
    uVar4 = 0;
    iVar2 = 0;
    do {
      iVar1 = XConvertUtf8ToUcs(buf + uVar4,len - (int)uVar4,&local_34);
      if (iVar1 < 2) {
        iVar1 = 1;
      }
      iVar2 = iVar2 + 1;
      uVar3 = (int)uVar4 + iVar1;
      uVar4 = (ulong)uVar3;
    } while ((int)uVar3 < len);
  }
  return iVar2;
}

Assistant:

int 
XCountUtf8Char(const unsigned char 	*buf, 
	       int 			len) {

  int i = 0;
  int nbc = 0;
  while (i < len) {
    int cl = XUtf8CharByteLen(buf + i, len - i);
    if (cl < 1) cl = 1;
    nbc++;
    i += cl;
  }
  return nbc;
}